

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O2

void * index234(tree234 *t,int index)

{
  int iVar1;
  long lVar2;
  node234_conflict *n;
  long lVar3;
  
  n = t->root;
  if ((-1 < index && n != (node234_conflict *)0x0) && (iVar1 = countnode234(n), index < iVar1)) {
    for (; n != (node234_conflict *)0x0; n = *(node234_conflict **)((long)n->kids + lVar3 + -8)) {
      lVar3 = 8;
      if ((n->counts[0] <= index) &&
         ((index = index + ~n->counts[0], lVar2 = 0x38, index < 0 ||
          ((lVar3 = 0x10, n->counts[1] <= index &&
           ((index = index + ~n->counts[1], lVar2 = 0x40, index < 0 ||
            ((lVar3 = 0x18, n->counts[2] <= index &&
             (index = index + ~n->counts[2], lVar2 = 0x48, lVar3 = 0x20, index < 0)))))))))) {
        return *(void **)((long)n->kids + lVar2 + -8);
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *index234(tree234 * t, int index)
{
    node234 *n;

    if (!t->root)
        return NULL;                   /* tree is empty */

    if (index < 0 || index >= countnode234(t->root))
        return NULL;                   /* out of range */

    n = t->root;

    while (n) {
        if (index < n->counts[0])
            n = n->kids[0];
        else if (index -= n->counts[0] + 1, index < 0)
            return n->elems[0];
        else if (index < n->counts[1])
            n = n->kids[1];
        else if (index -= n->counts[1] + 1, index < 0)
            return n->elems[1];
        else if (index < n->counts[2])
            n = n->kids[2];
        else if (index -= n->counts[2] + 1, index < 0)
            return n->elems[2];
        else
            n = n->kids[3];
    }

    /* We shouldn't ever get here. I wonder how we did. */
    return NULL;
}